

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::findLastMatchingRecording
          (ArchiveProxy *this,int64_t minRecordingId,string *channelFragment,int32_t streamId,
          int32_t sessionId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  FindLastMatchingRecordingRequest *pFVar2;
  uint64_t uVar3;
  undefined1 local_68 [8];
  FindLastMatchingRecordingRequest msg;
  int64_t correlationId_local;
  int32_t sessionId_local;
  int32_t streamId_local;
  string *channelFragment_local;
  int64_t minRecordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = correlationId;
  io::aeron::archive::codecs::FindLastMatchingRecordingRequest::FindLastMatchingRecordingRequest
            ((FindLastMatchingRecordingRequest *)local_68);
  pFVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::FindLastMatchingRecordingRequest>
                     (this,(FindLastMatchingRecordingRequest *)local_68);
  pFVar2 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::controlSessionId
                     (pFVar2,controlSessionId);
  pFVar2 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::correlationId
                     (pFVar2,msg.m_actingVersion);
  pFVar2 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::minRecordingId
                     (pFVar2,minRecordingId);
  pFVar2 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::sessionId(pFVar2,sessionId)
  ;
  pFVar2 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::streamId(pFVar2,streamId);
  io::aeron::archive::codecs::FindLastMatchingRecordingRequest::putChannel(pFVar2,channelFragment);
  uVar3 = io::aeron::archive::codecs::FindLastMatchingRecordingRequest::encodedLength
                    ((FindLastMatchingRecordingRequest *)local_68);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::findLastMatchingRecording(std::int64_t minRecordingId, const std::string& channelFragment, std::int32_t streamId,
                                   std::int32_t sessionId, std::int64_t correlationId, std::int64_t controlSessionId)
{
    codecs::FindLastMatchingRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .minRecordingId(minRecordingId)
        .sessionId(sessionId)
        .streamId(streamId)
        .putChannel(channelFragment);

    return offer(msg.encodedLength());
}